

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O2

bool add_packed_varyings(gl_context *ctx,gl_shader_program *shProg,set *resource_set,int stage,
                        GLenum type)

{
  char cVar1;
  undefined4 uVar2;
  char *pcVar3;
  long lVar4;
  ir_variable *var;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *__ptr;
  char *pcVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  long *plVar12;
  long *plVar13;
  bool bVar14;
  glsl_type *outermost_struct_type;
  char *local_38;
  
  lVar9 = *(long *)((ctx->GLThread).queue.name + (long)(int)(uint)resource_set * 8 + 0x78);
  if ((lVar9 == 0) || (plVar12 = *(long **)(lVar9 + 0x28), plVar12 == (long *)0x0)) {
LAB_00166606:
    bVar14 = true;
  }
  else {
    do {
      do {
        do {
          plVar12 = (long *)*plVar12;
          bVar14 = *plVar12 == 0;
          if (bVar14) goto LAB_00166606;
        } while (*(int *)(plVar12 + 2) != 7);
        uVar11 = *(uint *)(plVar12 + 7) >> 0xc & 0xf;
        iVar6 = 0x92e3;
        if (uVar11 != 4) {
          if (uVar11 != 5) {
            __assert_fail("!\"unexpected type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                          ,0xf97,
                          "bool add_packed_varyings(const struct gl_context *, struct gl_shader_program *, struct set *, int, GLenum)"
                         );
          }
          iVar6 = 0x92e4;
        }
      } while (iVar6 != stage);
      pcVar3 = (char *)plVar12[4];
      bVar10 = 0;
      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
        lVar4 = *(long *)((ctx->GLThread).queue.name + lVar9 * 8 + 0x78);
        if (lVar4 != 0) {
          plVar13 = *(long **)(lVar4 + 0x20);
          do {
            do {
              do {
                plVar13 = (long *)*plVar13;
                if (*plVar13 == 0) goto LAB_00166596;
              } while (*(int *)(plVar13 + 2) != 7);
              pcVar8 = (char *)plVar13[4];
              sVar7 = strlen(pcVar8);
              iVar6 = strncmp(pcVar8,"packed:",7);
              if (iVar6 == 0) {
                __ptr = strdup(pcVar8 + 7);
                pcVar8 = __ptr;
                if (__ptr == (char *)0x0) {
                  __assert_fail("list",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                                ,0xe15,
                                "bool included_in_packed_varying(ir_variable *, const char *)");
                }
                while (pcVar8 = strtok_r(pcVar8,",",&local_38), pcVar8 != (char *)0x0) {
                  iVar6 = strcmp(pcVar8,pcVar3);
                  if (iVar6 == 0) {
                    free(__ptr);
                    goto LAB_00166579;
                  }
                  pcVar8 = (char *)0x0;
                }
                free(__ptr);
              }
            } while ((*(uint *)(plVar13 + 7) >> 0xc & 0xf) != uVar11);
            iVar6 = strncmp((char *)plVar13[4],pcVar3,sVar7 & 0xffffffff);
          } while ((iVar6 != 0) ||
                  (((cVar1 = pcVar3[sVar7 & 0xffffffff], cVar1 != '\0' && (cVar1 != '[')) &&
                   (cVar1 != '.'))));
LAB_00166579:
          bVar10 = bVar10 | (byte)(1 << ((byte)lVar9 & 0x1f));
        }
LAB_00166596:
      }
      pcVar3 = (char *)plVar12[3];
      var = (ir_variable *)plVar12[4];
      uVar2 = *(undefined4 *)(plVar12 + 9);
      outermost_struct_type = (glsl_type *)0x1665c5;
      bVar5 = inout_has_same_location((ir_variable *)(plVar12 + -1),(uint)resource_set);
      bVar5 = add_shader_variable(ctx,shProg,(set *)(ulong)bVar10,stage,
                                  (GLenum)(ir_variable *)(plVar12 + -1),var,pcVar3,(glsl_type *)0x0,
                                  (bool)((char)uVar2 + -0x20),(uint)bVar5,false,
                                  outermost_struct_type);
    } while (bVar5);
  }
  return bVar14;
}

Assistant:

static bool
add_packed_varyings(const struct gl_context *ctx,
                    struct gl_shader_program *shProg,
                    struct set *resource_set,
                    int stage, GLenum type)
{
   struct gl_linked_shader *sh = shProg->_LinkedShaders[stage];
   GLenum iface;

   if (!sh || !sh->packed_varyings)
      return true;

   foreach_in_list(ir_instruction, node, sh->packed_varyings) {
      ir_variable *var = node->as_variable();
      if (var) {
         switch (var->data.mode) {
         case ir_var_shader_in:
            iface = GL_PROGRAM_INPUT;
            break;
         case ir_var_shader_out:
            iface = GL_PROGRAM_OUTPUT;
            break;
         default:
            unreachable("unexpected type");
         }

         if (type == iface) {
            const int stage_mask =
               build_stageref(shProg, var->name, var->data.mode);
            if (!add_shader_variable(ctx, shProg, resource_set,
                                     stage_mask,
                                     iface, var, var->name, var->type, false,
                                     var->data.location - VARYING_SLOT_VAR0,
                                     inout_has_same_location(var, stage)))
               return false;
         }
      }
   }
   return true;
}